

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

ByteData *
cfd::core::GetPsbtInput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_input *input,bool *is_find
          )

{
  allocator<unsigned_char> *paVar1;
  wally_map_item *pwVar2;
  wally_tx_witness_item *pwVar3;
  size_type sVar4;
  const_reference pvVar5;
  CfdException *pCVar6;
  uchar *puVar7;
  uchar *puVar8;
  CfdException *except_2;
  string local_7d8;
  size_t local_7b8;
  size_t index_2;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  ByteData local_748;
  ulong local_730;
  uint64_t idx;
  size_t num;
  Serializer builder_2;
  string local_6f0;
  CfdSourceLocation local_6d0;
  undefined1 local_6b1;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  undefined1 local_64a;
  allocator local_649;
  string local_648;
  CfdSourceLocation local_628;
  CfdException *except_1;
  string local_600;
  size_t local_5e0;
  size_t index_1;
  undefined1 local_5c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes_1;
  undefined1 local_590 [8];
  Pubkey pk_1;
  undefined1 local_570 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_1;
  string local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  undefined1 local_4ea;
  allocator local_4e9;
  string local_4e8;
  CfdSourceLocation local_4c8;
  undefined1 local_4a9;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  undefined1 local_442;
  allocator local_441;
  string local_440;
  CfdSourceLocation local_420;
  undefined1 local_401;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  undefined1 local_3a0 [8];
  Serializer builder_1;
  string local_370;
  CfdSourceLocation local_350;
  CfdException *except;
  string local_328;
  size_t local_308;
  size_t index;
  undefined1 local_2e8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  undefined1 local_2b8 [8];
  Pubkey pk;
  undefined1 local_298 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  ByteData local_218;
  undefined1 local_200 [8];
  Serializer builder;
  string local_1d0;
  CfdSourceLocation local_1b0;
  undefined1 local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  CfdSourceLocation local_110;
  int local_f4;
  ByteData local_f0;
  undefined1 local_d8 [8];
  Transaction tx;
  string local_90;
  CfdSourceLocation local_60;
  byte local_41;
  undefined1 local_40 [7];
  bool has_key_1byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  bool *is_find_local;
  wally_psbt_input *input_local;
  ByteData *key_data_local;
  
  key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = is_find;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,key_data);
  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = '\0';
  }
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  local_41 = sVar4 == 1;
  pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
  if (*pvVar5 == '\0') {
    if ((local_41 & 1) == 0) {
      local_60.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_60.filename = local_60.filename + 1;
      local_60.line = 0x4b6;
      local_60.funcname = "GetPsbtInput";
      logger::warn<>(&local_60,"psbt invalid key format.");
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_90,"psbt invalid key format error.",
                 (allocator *)
                 ((long)&tx.vout_.
                         super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_90);
      tx.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (input->utxo != (wally_tx *)0x0) {
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = '\x01';
      }
      ConvertBitcoinTxFromWally(&local_f0,input->utxo,false);
      Transaction::Transaction((Transaction *)local_d8,&local_f0);
      ByteData::~ByteData(&local_f0);
      AbstractTransaction::GetData(__return_storage_ptr__,(AbstractTransaction *)local_d8);
      local_f4 = 1;
      Transaction::~Transaction((Transaction *)local_d8);
      goto LAB_0059c790;
    }
    if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
      local_110.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_110.filename = local_110.filename + 1;
      local_110.line = 0x4bf;
      local_110.funcname = "GetPsbtInput";
      ByteData::GetHex_abi_cxx11_(&local_130,key_data);
      logger::warn<std::__cxx11::string>(&local_110,"psbt target {} not found.",&local_130);
      ::std::__cxx11::string::~string((string *)&local_130);
      local_191 = 1;
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      ByteData::GetHex_abi_cxx11_(&local_190,key_data);
      ::std::operator+(&local_170,"psbt target key ",&local_190);
      ::std::operator+(&local_150,&local_170," not found error.");
      CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_150);
      local_191 = 0;
      __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
    if (*pvVar5 == '\x01') {
      if ((local_41 & 1) == 0) {
        local_1b0.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                     ,0x2f);
        local_1b0.filename = local_1b0.filename + 1;
        local_1b0.line = 0x4c6;
        local_1b0.funcname = "GetPsbtInput";
        logger::warn<>(&local_1b0,"psbt invalid key format.");
        builder._38_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_1d0,"psbt invalid key format error.",
                   (allocator *)&builder.field_0x27);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_1d0);
        builder._38_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      if (input->witness_utxo != (wally_tx_output *)0x0) {
        if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = '\x01';
        }
        Serializer::Serializer((Serializer *)local_200);
        Serializer::AddDirectNumber((Serializer *)local_200,input->witness_utxo->satoshi);
        ByteData::ByteData(&local_218,input->witness_utxo->script,
                           (uint32_t)input->witness_utxo->script_len);
        Serializer::AddVariableBuffer((Serializer *)local_200,&local_218);
        ByteData::~ByteData(&local_218);
        Serializer::Output(__return_storage_ptr__,(Serializer *)local_200);
        local_f4 = 1;
        Serializer::~Serializer((Serializer *)local_200);
        goto LAB_0059c790;
      }
      if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_(&local_278,key_data);
        ::std::operator+(&local_258,"psbt target key ",&local_278);
        ::std::operator+(&local_238,&local_258," not found error.");
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_238);
        pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else {
      pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
      if (*pvVar5 == '\x02') {
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
        paVar1 = (allocator<unsigned_char> *)
                 ((long)&pk.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
        ::std::allocator<unsigned_char>::allocator(paVar1);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298,sVar4 - 1,
                   paVar1);
        ::std::allocator<unsigned_char>::~allocator
                  ((allocator<unsigned_char> *)
                   ((long)&pk.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
        if (sVar4 != 0) {
          puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
          puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
          sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
          memcpy(puVar7,puVar8 + 1,sVar4);
        }
        ByteData::ByteData((ByteData *)
                           &pk_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
        Pubkey::Pubkey((Pubkey *)local_2b8,
                       (ByteData *)
                       &pk_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
        ByteData::~ByteData((ByteData *)
                            &pk_bytes.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
        Pubkey::GetData((ByteData *)&index,(Pubkey *)local_2b8);
        ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e8,
                           (ByteData *)&index);
        ByteData::~ByteData((ByteData *)&index);
        local_308 = 0;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_328,"input signatures",(allocator *)((long)&except + 7));
        FindPsbtMap(&input->signatures,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e8,&local_328,
                    &local_308);
        ::std::__cxx11::string::~string((string *)&local_328);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&except + 7));
        if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage = '\x01';
        }
        pwVar2 = (input->signatures).items;
        ByteData::ByteData(__return_storage_ptr__,pwVar2[local_308].value,
                           (uint32_t)pwVar2[local_308].value_len);
        local_f4 = 1;
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e8);
        Pubkey::~Pubkey((Pubkey *)local_2b8);
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_298);
joined_r0x0059bf07:
        if (local_f4 != 0) goto LAB_0059c790;
      }
      else {
        pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
        if (*pvVar5 == '\x03') {
          if ((local_41 & 1) == 0) {
            local_350.filename =
                 strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                         ,0x2f);
            local_350.filename = local_350.filename + 1;
            local_350.line = 0x4ee;
            local_350.funcname = "GetPsbtInput";
            logger::warn<>(&local_350,"psbt invalid key format.");
            builder_1._38_1_ = 1;
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_370,"psbt invalid key format error.",
                       (allocator *)&builder_1.field_0x27);
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_370);
            builder_1._38_1_ = 0;
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
          if (input->sighash != 0) {
            if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage = '\x01';
            }
            Serializer::Serializer((Serializer *)local_3a0);
            Serializer::AddDirectNumber((Serializer *)local_3a0,input->sighash);
            Serializer::Output(__return_storage_ptr__,(Serializer *)local_3a0);
            local_f4 = 1;
            Serializer::~Serializer((Serializer *)local_3a0);
            goto LAB_0059c790;
          }
          if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            local_401 = 1;
            pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
            ByteData::GetHex_abi_cxx11_(&local_400,key_data);
            ::std::operator+(&local_3e0,"psbt target key ",&local_400);
            ::std::operator+(&local_3c0,&local_3e0," not found error.");
            CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_3c0);
            local_401 = 0;
            __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
          }
        }
        else {
          pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0);
          if (*pvVar5 == '\x04') {
            if ((local_41 & 1) == 0) {
              local_420.filename =
                   strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                           ,0x2f);
              local_420.filename = local_420.filename + 1;
              local_420.line = 0x4ff;
              local_420.funcname = "GetPsbtInput";
              logger::warn<>(&local_420,"psbt invalid key format.");
              local_442 = 1;
              pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_440,"psbt invalid key format error.",&local_441);
              CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_440);
              local_442 = 0;
              __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
            }
            if (input->redeem_script_len != 0) {
              if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage = '\x01';
              }
              ByteData::ByteData(__return_storage_ptr__,input->redeem_script,
                                 (uint32_t)input->redeem_script_len);
              local_f4 = 1;
              goto LAB_0059c790;
            }
            if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
              local_4a9 = 1;
              pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
              ByteData::GetHex_abi_cxx11_(&local_4a8,key_data);
              ::std::operator+(&local_488,"psbt target key ",&local_4a8);
              ::std::operator+(&local_468,&local_488," not found error.");
              CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_468);
              local_4a9 = 0;
              __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
            }
          }
          else {
            pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,0)
            ;
            if (*pvVar5 == '\x05') {
              if ((local_41 & 1) == 0) {
                local_4c8.filename =
                     strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                             ,0x2f);
                local_4c8.filename = local_4c8.filename + 1;
                local_4c8.line = 0x50f;
                local_4c8.funcname = "GetPsbtInput";
                logger::warn<>(&local_4c8,"psbt invalid key format.");
                local_4ea = 1;
                pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_4e8,"psbt invalid key format error.",&local_4e9);
                CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_4e8);
                local_4ea = 0;
                __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
              }
              if (input->witness_script_len != 0) {
                if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = '\x01';
                }
                ByteData::ByteData(__return_storage_ptr__,input->witness_script,
                                   (uint32_t)input->witness_script_len);
                local_f4 = 1;
                goto LAB_0059c790;
              }
              if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                pubkey_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
                pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                ByteData::GetHex_abi_cxx11_(&local_550,key_data);
                ::std::operator+(&local_530,"psbt target key ",&local_550);
                ::std::operator+(&local_510,&local_530," not found error.");
                CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_510);
                pubkey_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
                __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
              }
            }
            else {
              pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                                  0);
              if (*pvVar5 == '\x06') {
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40
                                  );
                paVar1 = (allocator<unsigned_char> *)
                         ((long)&pk_1.data_.data_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
                ::std::allocator<unsigned_char>::allocator(paVar1);
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_570,
                           sVar4 - 1,paVar1);
                ::std::allocator<unsigned_char>::~allocator
                          ((allocator<unsigned_char> *)
                           ((long)&pk_1.data_.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
                sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_570);
                if (sVar4 != 0) {
                  puVar7 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_570);
                  puVar8 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_40);
                  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_570);
                  memcpy(puVar7,puVar8 + 1,sVar4);
                }
                ByteData::ByteData((ByteData *)
                                   &pk_bytes_1.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_570);
                Pubkey::Pubkey((Pubkey *)local_590,
                               (ByteData *)
                               &pk_bytes_1.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                ByteData::~ByteData((ByteData *)
                                    &pk_bytes_1.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                Pubkey::GetData((ByteData *)&index_1,(Pubkey *)local_590);
                ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   local_5c0,(ByteData *)&index_1);
                ByteData::~ByteData((ByteData *)&index_1);
                local_5e0 = 0;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_600,"input bip32 pubkey",
                           (allocator *)((long)&except_1 + 7));
                FindPsbtMap(&input->keypaths,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5c0,
                            &local_600,&local_5e0);
                ::std::__cxx11::string::~string((string *)&local_600);
                ::std::allocator<char>::~allocator((allocator<char> *)((long)&except_1 + 7));
                if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = '\x01';
                }
                pwVar2 = (input->keypaths).items;
                ByteData::ByteData(__return_storage_ptr__,pwVar2[local_5e0].value,
                                   (uint32_t)pwVar2[local_5e0].value_len);
                local_f4 = 1;
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_5c0);
                Pubkey::~Pubkey((Pubkey *)local_590);
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_570);
                goto joined_r0x0059bf07;
              }
              pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                                  0);
              if (*pvVar5 == '\a') {
                if ((local_41 & 1) == 0) {
                  local_628.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                               ,0x2f);
                  local_628.filename = local_628.filename + 1;
                  local_628.line = 0x533;
                  local_628.funcname = "GetPsbtInput";
                  logger::warn<>(&local_628,"psbt invalid key format.");
                  local_64a = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_648,"psbt invalid key format error.",&local_649);
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_648);
                  local_64a = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
                if (input->final_scriptsig_len != 0) {
                  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = '\x01';
                  }
                  ByteData::ByteData(__return_storage_ptr__,input->final_scriptsig,
                                     (uint32_t)input->final_scriptsig_len);
                  local_f4 = 1;
                  goto LAB_0059c790;
                }
                if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  local_6b1 = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ByteData::GetHex_abi_cxx11_(&local_6b0,key_data);
                  ::std::operator+(&local_690,"psbt target key ",&local_6b0);
                  ::std::operator+(&local_670,&local_690," not found error.");
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_670);
                  local_6b1 = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
              }
              else {
                pvVar5 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_40,0);
                if (*pvVar5 != '\b') {
                  local_7b8 = 0;
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_7d8,"input unknowns",
                             (allocator *)((long)&except_2 + 7));
                  FindPsbtMap(&input->unknowns,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                              &local_7d8,&local_7b8);
                  ::std::__cxx11::string::~string((string *)&local_7d8);
                  ::std::allocator<char>::~allocator((allocator<char> *)((long)&except_2 + 7));
                  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = '\x01';
                  }
                  pwVar2 = (input->unknowns).items;
                  ByteData::ByteData(__return_storage_ptr__,pwVar2[local_7b8].value,
                                     (uint32_t)pwVar2[local_7b8].value_len);
                  local_f4 = 1;
                  goto LAB_0059c790;
                }
                if ((local_41 & 1) == 0) {
                  local_6d0.filename =
                       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                               ,0x2f);
                  local_6d0.filename = local_6d0.filename + 1;
                  local_6d0.line = 0x543;
                  local_6d0.funcname = "GetPsbtInput";
                  logger::warn<>(&local_6d0,"psbt invalid key format.");
                  builder_2._38_1_ = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            ((string *)&local_6f0,"psbt invalid key format error.",
                             (allocator *)&builder_2.field_0x27);
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_6f0);
                  builder_2._38_1_ = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
                if (input->final_witness != (wally_tx_witness_stack *)0x0) {
                  if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                    *key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage = '\x01';
                  }
                  Serializer::Serializer((Serializer *)&num);
                  idx = input->final_witness->num_items;
                  Serializer::AddVariableInt((Serializer *)&num,idx);
                  for (local_730 = 0; local_730 < idx; local_730 = local_730 + 1) {
                    pwVar3 = input->final_witness->items;
                    ByteData::ByteData(&local_748,pwVar3[local_730].witness,
                                       (uint32_t)pwVar3[local_730].witness_len);
                    Serializer::AddVariableBuffer((Serializer *)&num,&local_748);
                    ByteData::~ByteData(&local_748);
                  }
                  Serializer::Output(__return_storage_ptr__,(Serializer *)&num);
                  local_f4 = 1;
                  Serializer::~Serializer((Serializer *)&num);
                  goto LAB_0059c790;
                }
                if (key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  index_2._7_1_ = 1;
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  ByteData::GetHex_abi_cxx11_(&local_7a8,key_data);
                  ::std::operator+(&local_788,"psbt target key ",&local_7a8);
                  ::std::operator+(&local_768,&local_788," not found error.");
                  CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&local_768);
                  index_2._7_1_ = 0;
                  __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
                }
              }
            }
          }
        }
      }
    }
  }
  ByteData::ByteData(__return_storage_ptr__);
  local_f4 = 1;
LAB_0059c790:
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtInput(
    const ByteData &key_data, const struct wally_psbt_input *input,
    bool *is_find) {
  const auto key = key_data.GetBytes();
  if (is_find != nullptr) *is_find = false;
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtInputNonWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Transaction tx(ConvertBitcoinTxFromWally(input->utxo, false));
      return tx.GetData();
    } else if (is_find == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt target {} not found.", key_data.GetHex());
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessUtxo) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    // TODO(k-matsuzawa) need endian support.
    if (input->witness_utxo != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      builder.AddDirectNumber(input->witness_utxo->satoshi);
      builder.AddVariableBuffer(ByteData(
          input->witness_utxo->script,
          static_cast<uint32_t>(input->witness_utxo->script_len)));
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputPartialSig) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->signatures, pk_bytes, "input signatures", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->signatures.items[index].value,
          static_cast<uint32_t>(input->signatures.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputSighashType) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->sighash != 0) {
      if (is_find != nullptr) *is_find = true;
      // TODO(k-matsuzawa) need endian support.
      Serializer builder;
      builder.AddDirectNumber(input->sighash);
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->redeem_script,
          static_cast<uint32_t>(input->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->witness_script,
          static_cast<uint32_t>(input->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&input->keypaths, pk_bytes, "input bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->keypaths.items[index].value,
          static_cast<uint32_t>(input->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptsig) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_scriptsig_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->final_scriptsig,
          static_cast<uint32_t>(input->final_scriptsig_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtInputFinalScriptWitness) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (input->final_witness != nullptr) {
      if (is_find != nullptr) *is_find = true;
      Serializer builder;
      size_t num = input->final_witness->num_items;
      builder.AddVariableInt(num);
      for (uint64_t idx = 0; idx < num; ++idx) {
        builder.AddVariableBuffer(ByteData(
            input->final_witness->items[idx].witness,
            static_cast<uint32_t>(
                input->final_witness->items[idx].witness_len)));
      }
      return builder.Output();
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&input->unknowns, key, "input unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          input->unknowns.items[index].value,
          static_cast<uint32_t>(input->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}